

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgFunctionGenerator.cpp
# Opt level: O2

void __thiscall rsg::FunctionGenerator::generate(FunctionGenerator *this)

{
  Variable *variable;
  Function *pFVar1;
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ValueEntry *pVVar4;
  Scalar *pSVar5;
  AssignStatement *this_00;
  pointer ppVVar6;
  Scalar *pSVar7;
  StridedValueAccess<1> local_128;
  StridedValueRead<1> local_118;
  vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> statementStack;
  Statement *childStatement;
  Scalar *local_60;
  Scalar *local_58;
  Scalar *local_48;
  Scalar *local_40;
  
  statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_state->m_statementStack = &statementStack;
  childStatement = &(this->m_function->m_functionBlock).super_Statement;
  std::vector<rsg::Statement*,std::allocator<rsg::Statement*>>::emplace_back<rsg::Statement*>
            ((vector<rsg::Statement*,std::allocator<rsg::Statement*>> *)&statementStack,
             &childStatement);
  BlockStatement::init(&this->m_function->m_functionBlock,(EVP_PKEY_CTX *)this->m_state);
  while (statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = (*statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_Statement[2])
                      (statementStack.
                       super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],this->m_state);
    childStatement = (Statement *)CONCAT44(extraout_var,iVar3);
    if (childStatement == (Statement *)0x0) {
      statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
      .super__Vector_impl_data._M_finish =
           statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
    }
    else {
      std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::push_back
                (&statementStack,&childStatement);
    }
  }
  for (ppVVar6 = (this->m_requiredAssignments).
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar6 !=
      (this->m_requiredAssignments).
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar6 = ppVVar6 + 1) {
    variable = *ppVVar6;
    pVVar4 = VariableManager::getValue(this->m_state->m_varManager,variable);
    ValueRange::ValueRange((ValueRange *)&childStatement,&variable->m_type);
    local_118.m_value =
         (pVVar4->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if (local_118.m_value ==
        (pVVar4->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_118.m_value = (pointer)0x0;
    }
    local_128.super_ConstStridedValueAccess<1>.m_value = local_60;
    if (local_60 == local_58) {
      local_128.super_ConstStridedValueAccess<1>.m_value = (Scalar *)0x0;
    }
    local_128.super_ConstStridedValueAccess<1>.m_type = (VariableType *)&childStatement;
    local_118.m_type = &(pVVar4->m_valueRange).m_type;
    StridedValueAccess<1>::operator=(&local_128,&local_118);
    local_118.m_value =
         (pVVar4->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if (local_118.m_value ==
        (pVVar4->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_118.m_value = (pointer)0x0;
    }
    local_128.super_ConstStridedValueAccess<1>.m_value = local_48;
    if (local_48 == local_40) {
      local_128.super_ConstStridedValueAccess<1>.m_value = (Scalar *)0x0;
    }
    local_128.super_ConstStridedValueAccess<1>.m_type = (VariableType *)&childStatement;
    local_118.m_type = &(pVVar4->m_valueRange).m_type;
    StridedValueAccess<1>::operator=(&local_128,&local_118);
    VariableManager::removeValueFromCurrentScope(this->m_state->m_varManager,variable);
    pSVar5 = local_60;
    if (local_60 == local_58) {
      pSVar5 = (Scalar *)0x0;
    }
    pSVar7 = local_48;
    if (local_48 == local_40) {
      pSVar7 = (Scalar *)0x0;
    }
    valueRange.m_min = pSVar5;
    valueRange.m_type = (VariableType *)&childStatement;
    valueRange.m_max = pSVar7;
    bVar2 = isUndefinedValueRange(valueRange);
    if (!bVar2) {
      pFVar1 = this->m_function;
      this_00 = (AssignStatement *)operator_new(0x18);
      pSVar5 = local_60;
      if (local_60 == local_58) {
        pSVar5 = (Scalar *)0x0;
      }
      pSVar7 = local_48;
      if (local_48 == local_40) {
        pSVar7 = (Scalar *)0x0;
      }
      valueRange_00.m_min = pSVar5;
      valueRange_00.m_type = (VariableType *)&childStatement;
      valueRange_00.m_max = pSVar7;
      AssignStatement::AssignStatement(this_00,this->m_state,variable,valueRange_00);
      BlockStatement::addChild(&pFVar1->m_functionBlock,(Statement *)this_00);
    }
    ValueRange::~ValueRange((ValueRange *)&childStatement);
  }
  std::_Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::~_Vector_base
            (&statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
            );
  return;
}

Assistant:

void FunctionGenerator::generate (void)
{
	std::vector<Statement*>	statementStack;

	// Initialize
	m_state.setStatementStack(statementStack);
	statementStack.push_back(&m_function.getBody());
	m_function.getBody().init(m_state);

	// Process until statement stack is empty
	while (!statementStack.empty())
	{
		DE_ASSERT((int)statementStack.size() <= m_state.getShaderParameters().maxStatementDepth);

		Statement*	curStatement	= statementStack.back();
		Statement*	childStatement	= curStatement->createNextChild(m_state);

		if (childStatement)
			statementStack.push_back(childStatement);
		else
			statementStack.pop_back();
	}

	// Create assignments if variables have bound value range
	for (vector<Variable*>::iterator i = m_requiredAssignments.begin(); i != m_requiredAssignments.end(); i++)
	{
		Variable*				variable		= *i;
		const ValueEntry*		entry			= m_state.getVariableManager().getValue(variable);
		ValueRange				valueRange(variable->getType());

		valueRange.getMin() = entry->getValueRange().getMin().value();
		valueRange.getMax() = entry->getValueRange().getMax().value();

		// Remove value entry from this scope. After this entry ptr is invalid.
		m_state.getVariableManager().removeValueFromCurrentScope(variable);

		if (!isUndefinedValueRange(valueRange.asAccess()))
			m_function.getBody().addChild(new AssignStatement(m_state, variable, valueRange.asAccess()));
	}
}